

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O3

int lws_hex_to_byte_array(char *h,uint8_t *dest,int max)

{
  char cVar1;
  int iVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  
  iVar2 = -1;
  if (max != 0) {
    lVar3 = 0;
    while (cVar1 = h[lVar3 * 2], cVar1 != '\0') {
      bVar4 = cVar1 - 0x30;
      if (9 < bVar4) {
        if ((byte)(cVar1 + 0x9fU) < 6) {
          bVar4 = cVar1 + 0xa9;
        }
        else {
          bVar4 = cVar1 - 0x37;
          if (5 < (byte)(cVar1 + 0xbfU)) {
            bVar4 = 0xff;
          }
        }
      }
      cVar1 = h[lVar3 * 2 + 1];
      if (cVar1 == '\0') {
        return -1;
      }
      if ((char)bVar4 < '\0') {
        return -1;
      }
      bVar5 = cVar1 - 0x30;
      if (9 < bVar5) {
        if ((byte)(cVar1 + 0x9fU) < 6) {
          bVar5 = cVar1 + 0xa9;
        }
        else {
          if ((byte)(cVar1 + 0xb9U) < 0xfa) {
            return -1;
          }
          bVar5 = cVar1 - 0x37;
        }
      }
      dest[lVar3] = bVar4 << 4 | bVar5;
      lVar3 = lVar3 + 1;
      if (max == (int)lVar3) {
        return -1;
      }
    }
    iVar2 = -1;
    if (0 < max - (int)lVar3) {
      iVar2 = (int)lVar3;
    }
  }
  return iVar2;
}

Assistant:

int
lws_hex_to_byte_array(const char *h, uint8_t *dest, int max)
{
	uint8_t *odest = dest;

	while (max-- && *h) {
		int t = char_to_hex(*h++), t1;

		if (!*h || t < 0)
			return -1;

		t1 = char_to_hex(*h++);
		if (t1 < 0)
			return -1;

		*dest++ = (t << 4) | t1;
	}

	if (max < 0)
		return -1;

	return lws_ptr_diff(dest, odest);
}